

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::rra(CPU *this)

{
  byte bVar1;
  Registers *pRVar2;
  
  pRVar2 = this->regs;
  bVar1 = pRVar2->f;
  pRVar2->f = (pRVar2->a & 1) << 4;
  pRVar2->a = pRVar2->a >> 1 | (bVar1 & 0x10) << 3;
  return 1;
}

Assistant:

int CPU::rra() {
    uint8_t carry = (regs.f & 0x10) << 3;
    regs.f = 0;
    if (regs.a & 0x1) {
        regs.f |= 0x10;
    }

    regs.a = (regs.a >> 1) + carry;
    return 1;
}